

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall test_parser::~test_parser(test_parser *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

object deserialize_bytes(bytes_view_type in_data, text_encoding in_write_encoding) override {
		std::u8string u8_string;

		switch (in_write_encoding) {
			case text_encoding::utf_8:
				u8_string = string_view_cast<char8_t>(in_data);
				break;
			case text_encoding::utf_16:
				u8_string = jessilib::string_cast<char8_t>(string_view_cast<char16_t>(in_data));
				break;
			case text_encoding::utf_32:
				u8_string = jessilib::string_cast<char8_t>(string_view_cast<char32_t>(in_data));
				break;
			case text_encoding::wchar:
				u8_string = jessilib::string_cast<char8_t>(string_view_cast<wchar_t>(in_data));
				break;
			case text_encoding::multibyte:
				u8_string = mbstring_to_ustring<char8_t>(string_view_cast<char>(in_data)).second;
				break;
			default:
				break;
		}

		return deserialize_impl(std::u8string_view{ u8_string });
	}